

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::initialize_quantization_lut
          (jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
           *this)

{
  int8_t iVar1;
  uint uVar2;
  pointer pcVar3;
  ulong uVar4;
  int iVar5;
  jpegls_pc_parameters presets;
  jpegls_pc_parameters local_34;
  
  if (((((this->traits_).near_lossless == 0) &&
       (uVar2 = (this->traits_).maximum_sample_value,
       (-1 << ((byte)(this->traits_).bits_per_pixel & 0x1f) ^ uVar2) == 0xffffffff)) &&
      (compute_default(&local_34,uVar2,0), local_34.threshold1 == this->t1_)) &&
     (((local_34.threshold2 == this->t2_ && (local_34.threshold3 == this->t3_)) &&
      ((uVar2 = (this->traits_).bits_per_pixel - 8, uVar2 < 9 &&
       ((0x115U >> (uVar2 & 0x1f) & 1) != 0)))))) {
    this->quantization_ =
         (int8_t *)
         (((ulong)(*(long *)(&PTR_DAT_0013bd18)[uVar2] -
                  *(long *)(&PTR_quantization_lut_lossless_8_0013bd60)[uVar2]) >> 1) +
         *(long *)(&PTR_quantization_lut_lossless_8_0013bd60)[uVar2]);
    return;
  }
  iVar5 = 1 << ((byte)(this->traits_).bits_per_pixel & 0x1f);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            (&this->quantization_lut_,(long)iVar5 * 2);
  pcVar3 = (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar3) {
    uVar4 = 0;
    do {
      iVar1 = quantize_gradient_org(this,(int)uVar4 - iVar5);
      (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar4] = iVar1;
      uVar4 = uVar4 + 1;
      pcVar3 = (this->quantization_lut_).
               super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->quantization_lut_).
                                   super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pcVar3));
  }
  this->quantization_ = pcVar3 + iVar5;
  return;
}

Assistant:

void initialize_quantization_lut()
    {
        // for lossless mode with default parameters, we have precomputed the look up table for bit counts 8, 10, 12 and 16.
        if (traits_.near_lossless == 0 && traits_.maximum_sample_value == (1 << traits_.bits_per_pixel) - 1)
        {
            const jpegls_pc_parameters presets{compute_default(traits_.maximum_sample_value, traits_.near_lossless)};
            if (presets.threshold1 == t1_ && presets.threshold2 == t2_ && presets.threshold3 == t3_)
            {
                if (traits_.bits_per_pixel == 8)
                {
                    quantization_ = &quantization_lut_lossless_8[quantization_lut_lossless_8.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 10)
                {
                    quantization_ = &quantization_lut_lossless_10[quantization_lut_lossless_10.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 12)
                {
                    quantization_ = &quantization_lut_lossless_12[quantization_lut_lossless_12.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 16)
                {
                    quantization_ = &quantization_lut_lossless_16[quantization_lut_lossless_16.size() / 2];
                    return;
                }
            }
        }

        // Initialize the quantization lookup table dynamic.
        const int32_t range{1 << traits_.bits_per_pixel};
        quantization_lut_.resize(static_cast<size_t>(range) * 2);
        for (size_t i{}; i < quantization_lut_.size(); ++i)
        {
            quantization_lut_[i] = quantize_gradient_org(-range + static_cast<int32_t>(i));
        }

        quantization_ = &quantization_lut_[range];
    }